

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O0

void Assimp::IFC::ProcessExtrudedArea
               (IfcExtrudedAreaSolid *solid,TempMesh *curve,IfcVector3 *extrusionDir,
               TempMesh *result,ConversionData *conv,bool collect_openings)

{
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *pvVar1;
  double dVar2;
  DistanceSorter __comp;
  IfcVector3 extrusionDir_00;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  IfcProfileDef *pIVar6;
  size_type sVar7;
  IfcAxis2Placement3D *in_00;
  aiVector3t<double> *paVar8;
  iterator __first;
  reference pvVar9;
  ulong uVar10;
  reference pvVar11;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *this;
  TempMesh *pTVar12;
  element_type *peVar13;
  element_type *this_00;
  bool local_589;
  TempMesh *local_540;
  bool local_511;
  shared_ptr<Assimp::IFC::TempMesh> local_4b8;
  shared_ptr<Assimp::IFC::TempMesh> local_4a8;
  double local_498;
  double dStack_490;
  double local_488;
  TempOpening local_478;
  value_type_conflict3 local_41c;
  aiVector3t<double> *local_418;
  aiVector3t<double> *local_410;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_408;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_400;
  const_iterator local_3f8;
  undefined1 local_3f0 [8];
  shared_ptr<Assimp::IFC::TempMesh> profile2D;
  shared_ptr<Assimp::IFC::TempMesh> profile;
  size_type local_3c8;
  size_t i_2;
  ulong local_3a8;
  size_t i_1;
  size_t n;
  size_t sides_with_v_openings;
  TempOpening *opening;
  iterator __end3_1;
  iterator __begin3_1;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *__range3_1;
  aiVector3t<double> local_358;
  aiVector3t<double> local_340;
  value_type_conflict3 local_324;
  ulong local_320;
  size_t next;
  size_t i;
  size_t sides_with_openings;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *out;
  TempMesh *curmesh;
  TempMesh temp;
  aiVector3t<double> local_2b0;
  aiVector3t<double> local_298;
  aiVector3t<double> local_280;
  element_type *local_268;
  TempMesh *bounds;
  TempOpening *t;
  iterator __end3;
  iterator __begin3;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *__range3;
  double dStack_238;
  double local_230;
  __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
  local_228;
  __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
  local_220;
  bool local_211;
  undefined1 local_210 [7];
  bool openings;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> nors;
  undefined1 local_1e8 [8];
  IfcVector3 profileNormal;
  undefined1 auStack_188 [8];
  IfcVector3 dir;
  IfcFloat diag;
  double local_160;
  double local_158;
  aiVector3t<double> local_150;
  aiVector3t<double> *local_138;
  IfcVector3 *v;
  iterator __end2;
  iterator __begin2;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range2;
  undefined1 local_110 [8];
  IfcVector3 vmax;
  IfcVector3 vmin;
  undefined1 local_d0 [8];
  IfcMatrix4 trafo;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> in;
  bool has_area;
  bool collect_openings_local;
  ConversionData *conv_local;
  TempMesh *result_local;
  IfcVector3 *extrusionDir_local;
  TempMesh *curve_local;
  IfcExtrudedAreaSolid *solid_local;
  
  pIVar6 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>::operator->
                     ((Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef> *)
                      &(solid->super_IfcSweptAreaSolid).super_IfcSolidModel.field_0x40);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &(pIVar6->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>)
                           .field_0x10,"AREA");
  bVar5 = false;
  if (bVar4) {
    sVar7 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                      (&curve->mVerts);
    bVar5 = 2 < sVar7;
  }
  if (solid->Depth <= 1e-06 && solid->Depth != 1e-06) {
    if (bVar5) {
      TempMesh::Append(result,curve);
    }
  }
  else {
    sVar7 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                      (&curve->mVerts);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&result->mVerts,sVar7 * ((uint)bVar5 * 2 + 2));
    sVar7 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                      (&curve->mVerts);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&result->mVertcnt,sVar7 + 2);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)&trafo.d4,
               &curve->mVerts);
    aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)local_d0);
    in_00 = STEP::Lazy::operator_cast_to_IfcAxis2Placement3D_
                      ((Lazy *)&(solid->super_IfcSweptAreaSolid).Position);
    ConvertAxisPlacement((IfcMatrix4 *)local_d0,in_00);
    aiVector3t<double>::aiVector3t((aiVector3t<double> *)&vmax.z);
    aiVector3t<double>::aiVector3t((aiVector3t<double> *)local_110);
    MinMaxChooser<aiVector3t<double>_>::operator()
              ((MinMaxChooser<aiVector3t<double>_> *)((long)&__range2 + 7),
               (aiVector3t<double> *)&vmax.z,(aiVector3t<double> *)local_110);
    __end2 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                       ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                        &trafo.d4);
    v = (IfcVector3 *)
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                  ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)&trafo.d4);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                       *)&v), bVar4) {
      local_138 = __gnu_cxx::
                  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                  ::operator*(&__end2);
      aiVector3t<double>::operator*=(local_138,(aiMatrix4x4t<double> *)local_d0);
      std::min<double>(&local_150,(aiVector3t<double> *)&vmax.z,local_138);
      vmax.z = local_150.x;
      std::max<double>((aiVector3t<double> *)&diag,(aiVector3t<double> *)local_110,local_138);
      local_110 = (undefined1  [8])diag;
      vmax.x = local_160;
      vmax.y = local_158;
      __gnu_cxx::
      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
      ::operator++(&__end2);
    }
    aiVector3t<double>::operator-=((aiVector3t<double> *)local_110,(aiVector3t<double> *)&vmax.z);
    dir.z = aiVector3t<double>::Length((aiVector3t<double> *)local_110);
    aiMatrix3x3t<double>::aiMatrix3x3t
              ((aiMatrix3x3t<double> *)&profileNormal.z,(aiMatrix4x4t<double> *)local_d0);
    ::operator*((aiVector3t<double> *)auStack_188,(aiMatrix3x3t<double> *)&profileNormal.z,
                extrusionDir);
    paVar8 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::data
                       ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                        &trafo.d4);
    sVar7 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                      ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)&trafo.d4
                      );
    TempMesh::ComputePolygonNormal((IfcVector3 *)local_1e8,paVar8,sVar7,true);
    dVar2 = ::operator*((aiVector3t<double> *)local_1e8,(aiVector3t<double> *)auStack_188);
    if (dVar2 < 0.0) {
      __first = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                          ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                           &trafo.d4);
      nors.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                               &trafo.d4);
      std::
      reverse<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                ((__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                  )nors.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)local_210);
    local_511 = false;
    if (conv->apply_openings !=
        (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0) {
      sVar7 = std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::size
                        (conv->apply_openings);
      local_511 = sVar7 != 0;
    }
    local_211 = local_511;
    if (local_511 != false) {
      if ((conv->settings->useCustomTriangulation & 1U) == 0) {
        local_220._M_current =
             (TempOpening *)
             std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::begin
                       (conv->apply_openings);
        local_228._M_current =
             (TempOpening *)
             std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::end
                       (conv->apply_openings);
        pvVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                           ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                            &trafo.d4,0);
        TempOpening::DistanceSorter::DistanceSorter((DistanceSorter *)&__range3,pvVar9);
        __comp.base.y = dStack_238;
        __comp.base.x = (double)__range3;
        __comp.base.z = local_230;
        std::
        sort<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening*,std::vector<Assimp::IFC::TempOpening,std::allocator<Assimp::IFC::TempOpening>>>,Assimp::IFC::TempOpening::DistanceSorter>
                  (local_220,local_228,__comp);
      }
      sVar7 = std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::size
                        (conv->apply_openings);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)local_210,sVar7
                );
      pvVar1 = conv->apply_openings;
      __end3 = std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
               begin(pvVar1);
      t = (TempOpening *)
          std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::end
                    (pvVar1);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
                                         *)&t), bVar4) {
        bounds = (TempMesh *)
                 __gnu_cxx::
                 __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
                 ::operator*(&__end3);
        local_268 = std::__shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>::get
                              (&(((reference)bounds)->profileMesh).
                                super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                              );
        sVar7 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                          (&local_268->mVerts);
        if (sVar7 < 3) {
          aiVector3t<double>::aiVector3t(&local_280);
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                    ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)local_210,
                     &local_280);
        }
        else {
          pvVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                             (&local_268->mVerts,2);
          pvVar11 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                    operator[](&local_268->mVerts,0);
          ::operator-(&local_2b0,pvVar9,pvVar11);
          pvVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                             (&local_268->mVerts,1);
          pvVar11 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                    operator[](&local_268->mVerts,0);
          ::operator-((aiVector3t<double> *)
                      &temp.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar9,pvVar11);
          operator^(&local_298,&local_2b0,
                    (aiVector3t<double> *)
                    &temp.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
          paVar8 = aiVector3t<double>::Normalize(&local_298);
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                    ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)local_210,
                     paVar8);
        }
        __gnu_cxx::
        __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
        ::operator++(&__end3);
      }
    }
    TempMesh::TempMesh((TempMesh *)&curmesh);
    local_540 = result;
    if ((local_211 & 1U) != 0) {
      local_540 = (TempMesh *)&curmesh;
    }
    out = &local_540->mVerts;
    sides_with_openings = (size_t)local_540;
    i = 0;
    for (next = 0; sVar3 = next,
        sVar7 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                          ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                           &trafo.d4), sVar3 < sVar7; next = next + 1) {
      uVar10 = next + 1;
      sVar7 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                        ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                         &trafo.d4);
      local_320 = uVar10 % sVar7;
      local_324 = 4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(out + 1),&local_324);
      sVar3 = sides_with_openings;
      pvVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                         ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                          &trafo.d4,next);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)sVar3,pvVar9);
      sVar3 = sides_with_openings;
      pvVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                         ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                          &trafo.d4,local_320);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)sVar3,pvVar9);
      sVar3 = sides_with_openings;
      pvVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                         ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                          &trafo.d4,local_320);
      ::operator+(&local_340,pvVar9,(aiVector3t<double> *)auStack_188);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)sVar3,
                 &local_340);
      sVar3 = sides_with_openings;
      pvVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                         ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                          &trafo.d4,next);
      ::operator+(&local_358,pvVar9,(aiVector3t<double> *)auStack_188);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)sVar3,
                 &local_358);
      if ((local_211 & 1U) != 0) {
        pvVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                           ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                            &trafo.d4,next);
        pvVar11 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                             &trafo.d4,local_320);
        ::operator-((aiVector3t<double> *)&__range3_1,pvVar9,pvVar11);
        dVar2 = aiVector3t<double>::Length((aiVector3t<double> *)&__range3_1);
        local_589 = false;
        if (dir.z * 0.1 < dVar2) {
          local_589 = GenerateOpenings(conv->apply_openings,
                                       (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        *)local_210,(TempMesh *)&curmesh,true,true,
                                       (IfcVector3 *)auStack_188);
        }
        if (local_589 != false) {
          i = i + 1;
        }
        TempMesh::Append(result,(TempMesh *)&curmesh);
        TempMesh::Clear((TempMesh *)&curmesh);
      }
    }
    if ((local_211 & 1U) != 0) {
      pvVar1 = conv->apply_openings;
      __end3_1 = std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
                 begin(pvVar1);
      opening = (TempOpening *)
                std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
                end(pvVar1);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
                                 *)&opening), bVar4) {
        sides_with_v_openings =
             (size_t)__gnu_cxx::
                     __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
                     ::operator*(&__end3_1);
        bVar4 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::empty
                          (&((reference)sides_with_v_openings)->wallPoints);
        if (!bVar4) {
          LogFunctions<Assimp::IFCImporter>::LogError("failed to generate all window caps");
        }
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::clear
                  ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                   (sides_with_v_openings + 0x40));
        __gnu_cxx::
        __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
        ::operator++(&__end3_1);
      }
    }
    n = 0;
    if (bVar5 != false) {
      for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
        if (i_1 == 0) {
          local_3c8 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *
                                 )&trafo.d4);
          while (sVar3 = sides_with_openings, local_3c8 != 0) {
            pvVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                     operator[]((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                                &trafo.d4,local_3c8 - 1);
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)sVar3,
                       pvVar9);
            local_3c8 = local_3c8 - 1;
          }
        }
        else {
          for (local_3a8 = 0; uVar10 = local_3a8,
              sVar7 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *
                                 )&trafo.d4), sVar3 = sides_with_openings, uVar10 < sVar7;
              local_3a8 = local_3a8 + 1) {
            pvVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                     operator[]((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                                &trafo.d4,local_3a8);
            ::operator+((aiVector3t<double> *)&i_2,pvVar9,(aiVector3t<double> *)auStack_188);
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)sVar3,
                       (value_type *)&i_2);
          }
        }
        this = out + 1;
        sVar7 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                          ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                           &trafo.d4);
        profile.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = (undefined4)sVar7;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                   (value_type_conflict3 *)
                   ((long)&profile.
                           super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 4));
        if (((local_211 & 1U) != 0) &&
           (sVar7 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                               &trafo.d4), 2 < sVar7)) {
          bVar5 = GenerateOpenings(conv->apply_openings,
                                   (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                    *)local_210,(TempMesh *)&curmesh,true,true,
                                   (IfcVector3 *)auStack_188);
          if (bVar5) {
            n = n + 1;
          }
          TempMesh::Append(result,(TempMesh *)&curmesh);
          TempMesh::Clear((TempMesh *)&curmesh);
        }
      }
    }
    if (((local_211 & 1U) != 0) && ((i == 1 || (n == 2)))) {
      LogFunctions<Assimp::IFCImporter>::LogWarn
                (
                "failed to resolve all openings, presumably their topology is not supported by Assimp"
                );
    }
    LogFunctions<Assimp::IFCImporter>::LogDebug
              ("generate mesh procedurally by extrusion (IfcExtrudedAreaSolid)");
    if ((collect_openings) && (bVar5 = TempMesh::IsEmpty(result), !bVar5)) {
      if (conv->collect_openings ==
          (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0) {
        __assert_fail("conv.collect_openings",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCGeometry.cpp"
                      ,0x29b,
                      "void Assimp::IFC::ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid &, const TempMesh &, const IfcVector3 &, TempMesh &, ConversionData &, bool)"
                     );
      }
      pTVar12 = (TempMesh *)operator_new(0x30);
      (pTVar12->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pTVar12->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pTVar12->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pTVar12->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pTVar12->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pTVar12->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      TempMesh::TempMesh(pTVar12);
      std::shared_ptr<Assimp::IFC::TempMesh>::shared_ptr<Assimp::IFC::TempMesh,void>
                ((shared_ptr<Assimp::IFC::TempMesh> *)
                 &profile2D.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,pTVar12);
      peVar13 = std::
                __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&profile2D.
                                 super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      TempMesh::Swap(peVar13,result);
      pTVar12 = (TempMesh *)operator_new(0x30);
      (pTVar12->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pTVar12->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pTVar12->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pTVar12->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pTVar12->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pTVar12->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      TempMesh::TempMesh(pTVar12);
      std::shared_ptr<Assimp::IFC::TempMesh>::shared_ptr<Assimp::IFC::TempMesh,void>
                ((shared_ptr<Assimp::IFC::TempMesh> *)local_3f0,pTVar12);
      peVar13 = std::
                __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_3f0);
      this_00 = std::
                __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_3f0);
      local_400._M_current =
           (aiVector3t<double> *)
           std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                     (&this_00->mVerts);
      __gnu_cxx::
      __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
      ::__normal_iterator<aiVector3t<double>*>
                ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                  *)&local_3f8,&local_400);
      local_408._M_current =
           (aiVector3t<double> *)
           std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                     ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)&trafo.d4)
      ;
      local_410 = (aiVector3t<double> *)
                  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                             &trafo.d4);
      local_418 = (aiVector3t<double> *)
                  std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                  insert<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,void>
                            ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                             peVar13,local_3f8,local_408,
                             (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                              )local_410);
      peVar13 = std::
                __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_3f0);
      sVar7 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                        ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                         &trafo.d4);
      local_41c = (value_type_conflict3)sVar7;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&peVar13->mVertcnt,&local_41c);
      pvVar1 = conv->collect_openings;
      local_488 = dir.y;
      local_498 = (double)auStack_188;
      dStack_490 = dir.x;
      std::shared_ptr<Assimp::IFC::TempMesh>::shared_ptr
                (&local_4a8,
                 (shared_ptr<Assimp::IFC::TempMesh> *)
                 &profile2D.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<Assimp::IFC::TempMesh>::shared_ptr
                (&local_4b8,(shared_ptr<Assimp::IFC::TempMesh> *)local_3f0);
      extrusionDir_00.y = dStack_490;
      extrusionDir_00.x = local_498;
      extrusionDir_00.z = local_488;
      TempOpening::TempOpening
                (&local_478,(IfcSolidModel *)solid,extrusionDir_00,&local_4a8,&local_4b8);
      std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::push_back
                (pvVar1,&local_478);
      TempOpening::~TempOpening(&local_478);
      std::shared_ptr<Assimp::IFC::TempMesh>::~shared_ptr(&local_4b8);
      std::shared_ptr<Assimp::IFC::TempMesh>::~shared_ptr(&local_4a8);
      bVar5 = TempMesh::IsEmpty(result);
      if (!bVar5) {
        __assert_fail("result.IsEmpty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCGeometry.cpp"
                      ,0x2a4,
                      "void Assimp::IFC::ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid &, const TempMesh &, const IfcVector3 &, TempMesh &, ConversionData &, bool)"
                     );
      }
      std::shared_ptr<Assimp::IFC::TempMesh>::~shared_ptr
                ((shared_ptr<Assimp::IFC::TempMesh> *)local_3f0);
      std::shared_ptr<Assimp::IFC::TempMesh>::~shared_ptr
                ((shared_ptr<Assimp::IFC::TempMesh> *)
                 &profile2D.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    TempMesh::~TempMesh((TempMesh *)&curmesh);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~vector
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)local_210);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~vector
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)&trafo.d4);
  }
  return;
}

Assistant:

void ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid& solid, const TempMesh& curve,
    const IfcVector3& extrusionDir, TempMesh& result, ConversionData &conv, bool collect_openings)
{
    // Outline: 'curve' is now a list of vertex points forming the underlying profile, extrude along the given axis,
    // forming new triangles.
    const bool has_area = solid.SweptArea->ProfileType == "AREA" && curve.mVerts.size() > 2;
    if( solid.Depth < 1e-6 ) {
        if( has_area ) {
            result.Append(curve);
        }
        return;
    }

    result.mVerts.reserve(curve.mVerts.size()*(has_area ? 4 : 2));
    result.mVertcnt.reserve(curve.mVerts.size() + 2);
    std::vector<IfcVector3> in = curve.mVerts;

    // First step: transform all vertices into the target coordinate space
    IfcMatrix4 trafo;
    ConvertAxisPlacement(trafo, solid.Position);

    IfcVector3 vmin, vmax;
    MinMaxChooser<IfcVector3>()(vmin, vmax);
    for(IfcVector3& v : in) {
        v *= trafo;

        vmin = std::min(vmin, v);
        vmax = std::max(vmax, v);
    }

    vmax -= vmin;
    const IfcFloat diag = vmax.Length();
    IfcVector3 dir = IfcMatrix3(trafo) * extrusionDir;

    // reverse profile polygon if it's winded in the wrong direction in relation to the extrusion direction
    IfcVector3 profileNormal = TempMesh::ComputePolygonNormal(in.data(), in.size());
    if( profileNormal * dir < 0.0 )
        std::reverse(in.begin(), in.end());

    std::vector<IfcVector3> nors;
    const bool openings = !!conv.apply_openings && conv.apply_openings->size();

    // Compute the normal vectors for all opening polygons as a prerequisite
    // to TryAddOpenings_Poly2Tri()
    // XXX this belongs into the aforementioned function
    if( openings ) {

        if( !conv.settings.useCustomTriangulation ) {
            // it is essential to apply the openings in the correct spatial order. The direction
            // doesn't matter, but we would screw up if we started with e.g. a door in between
            // two windows.
            std::sort(conv.apply_openings->begin(), conv.apply_openings->end(), TempOpening::DistanceSorter(in[0]));
        }

        nors.reserve(conv.apply_openings->size());
        for(TempOpening& t : *conv.apply_openings) {
            TempMesh& bounds = *t.profileMesh.get();

            if( bounds.mVerts.size() <= 2 ) {
                nors.push_back(IfcVector3());
                continue;
            }
            nors.push_back(((bounds.mVerts[2] - bounds.mVerts[0]) ^ (bounds.mVerts[1] - bounds.mVerts[0])).Normalize());
        }
    }


    TempMesh temp;
    TempMesh& curmesh = openings ? temp : result;
    std::vector<IfcVector3>& out = curmesh.mVerts;

    size_t sides_with_openings = 0;
    for( size_t i = 0; i < in.size(); ++i ) {
        const size_t next = (i + 1) % in.size();

        curmesh.mVertcnt.push_back(4);

        out.push_back(in[i]);
        out.push_back(in[next]);
        out.push_back(in[next] + dir);
        out.push_back(in[i] + dir);

        if( openings ) {
            if( (in[i] - in[next]).Length() > diag * 0.1 && GenerateOpenings(*conv.apply_openings, nors, temp, true, true, dir) ) {
                ++sides_with_openings;
            }

            result.Append(temp);
            temp.Clear();
        }
    }

    if( openings ) {
        for(TempOpening& opening : *conv.apply_openings) {
            if( !opening.wallPoints.empty() ) {
                IFCImporter::LogError("failed to generate all window caps");
            }
            opening.wallPoints.clear();
        }
    }

    size_t sides_with_v_openings = 0;
    if( has_area ) {

        for( size_t n = 0; n < 2; ++n ) {
            if( n > 0 ) {
                for( size_t i = 0; i < in.size(); ++i )
                    out.push_back(in[i] + dir);
            }
            else {
                for( size_t i = in.size(); i--; )
                    out.push_back(in[i]);
            }

            curmesh.mVertcnt.push_back(static_cast<unsigned int>(in.size()));
            if( openings && in.size() > 2 ) {
                if( GenerateOpenings(*conv.apply_openings, nors, temp, true, true, dir) ) {
                    ++sides_with_v_openings;
                }

                result.Append(temp);
                temp.Clear();
            }
        }
    }

    if( openings && ((sides_with_openings == 1 && sides_with_openings) || (sides_with_v_openings == 2 && sides_with_v_openings)) ) {
        IFCImporter::LogWarn("failed to resolve all openings, presumably their topology is not supported by Assimp");
    }

    IFCImporter::LogDebug("generate mesh procedurally by extrusion (IfcExtrudedAreaSolid)");

    // If this is an opening element, store both the extruded mesh and the 2D profile mesh
    // it was created from. Return an empty mesh to the caller.
    if( collect_openings && !result.IsEmpty() ) {
        ai_assert(conv.collect_openings);
        std::shared_ptr<TempMesh> profile = std::shared_ptr<TempMesh>(new TempMesh());
        profile->Swap(result);

        std::shared_ptr<TempMesh> profile2D = std::shared_ptr<TempMesh>(new TempMesh());
        profile2D->mVerts.insert(profile2D->mVerts.end(), in.begin(), in.end());
        profile2D->mVertcnt.push_back(static_cast<unsigned int>(in.size()));
        conv.collect_openings->push_back(TempOpening(&solid, dir, profile, profile2D));

        ai_assert(result.IsEmpty());
    }
}